

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

char * Curl_copy_header_value(char *header)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  char *__dest;
  size_t sVar5;
  byte *__s;
  ulong uVar6;
  
  for (; (cVar1 = *header, cVar1 != '\0' && (cVar1 != ':')); header = header + 1) {
  }
  uVar6 = (ulong)(cVar1 != '\0');
  bVar2 = header[uVar6];
  while ((bVar2 != 0 && (iVar3 = Curl_isspace((uint)bVar2), iVar3 != 0))) {
    bVar2 = header[uVar6 + 1];
    uVar6 = uVar6 + 1;
  }
  __s = (byte *)(header + uVar6);
  pbVar4 = (byte *)strchr((char *)__s,0xd);
  if ((pbVar4 == (byte *)0x0) && (pbVar4 = (byte *)strchr((char *)__s,10), pbVar4 == (byte *)0x0)) {
    sVar5 = strlen((char *)__s);
    pbVar4 = __s + sVar5;
  }
  while ((__s < pbVar4 && (iVar3 = Curl_isspace((uint)*pbVar4), iVar3 != 0))) {
    pbVar4 = pbVar4 + -1;
  }
  __dest = (char *)(*Curl_cmalloc)((size_t)(pbVar4 + (2 - (long)__s)));
  if (__dest == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    memcpy(__dest,__s,(size_t)(pbVar4 + (1 - (long)__s)));
    __dest[(long)(pbVar4 + (1 - (long)__s))] = '\0';
  }
  return __dest;
}

Assistant:

char *Curl_copy_header_value(const char *header)
{
  const char *start;
  const char *end;
  char *value;
  size_t len;

  /* Find the end of the header name */
  while(*header && (*header != ':'))
    ++header;

  if(*header)
    /* Skip over colon */
    ++header;

  /* Find the first non-space letter */
  start = header;
  while(*start && ISSPACE(*start))
    start++;

  /* data is in the host encoding so
     use '\r' and '\n' instead of 0x0d and 0x0a */
  end = strchr(start, '\r');
  if(!end)
    end = strchr(start, '\n');
  if(!end)
    end = strchr(start, '\0');
  if(!end)
    return NULL;

  /* skip all trailing space letters */
  while((end > start) && ISSPACE(*end))
    end--;

  /* get length of the type */
  len = end - start + 1;

  value = malloc(len + 1);
  if(!value)
    return NULL;

  memcpy(value, start, len);
  value[len] = 0; /* null-terminate */

  return value;
}